

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g2d.c
# Opt level: O0

int g2d_polygon_rasterize(zarray_t *poly,double y,double *x)

{
  int iVar1;
  int iVar2;
  double local_c8;
  double q [2];
  double *local_b0;
  double *p1_1;
  double *p0_1;
  g2d_line_segment_t seg;
  int i;
  int xpos;
  double p1 [2];
  double p0 [2];
  g2d_line_t line;
  int sz;
  double *x_local;
  double y_local;
  zarray_t *poly_local;
  
  iVar1 = zarray_size(poly);
  p1[1] = 0.0;
  _i = 1.0;
  p1[0] = y;
  p0[0] = y;
  g2d_line_init_from_points((g2d_line_t *)(p0 + 1),p1 + 1,(double *)&i);
  seg.p1[1]._4_4_ = 0;
  for (seg.p1[1]._0_4_ = 0; seg.p1[1]._0_4_ < iVar1; seg.p1[1]._0_4_ = seg.p1[1]._0_4_ + 1) {
    zarray_get_volatile(poly,seg.p1[1]._0_4_,&p1_1);
    zarray_get_volatile(poly,(seg.p1[1]._0_4_ + 1) % iVar1,&local_b0);
    g2d_line_segment_init_from_points((g2d_line_segment_t *)&p0_1,p1_1,local_b0);
    iVar2 = g2d_line_segment_intersect_line
                      ((g2d_line_segment_t *)&p0_1,(g2d_line_t *)(p0 + 1),&local_c8);
    if (iVar2 != 0) {
      x[seg.p1[1]._4_4_] = local_c8;
      seg.p1[1]._4_4_ = seg.p1[1]._4_4_ + 1;
    }
  }
  qsort(x,(long)seg.p1[1]._4_4_,8,double_sort_up);
  return seg.p1[1]._4_4_;
}

Assistant:

int g2d_polygon_rasterize(const zarray_t *poly, double y, double *x)
{
    int sz = zarray_size(poly);

    g2d_line_t line;
    if (1) {
        double p0[2] = { 0, y };
        double p1[2] = { 1, y };

        g2d_line_init_from_points(&line, p0, p1);
    }

    int xpos = 0;

    for (int i = 0; i < sz; i++) {
        g2d_line_segment_t seg;
        double *p0, *p1;
        zarray_get_volatile(poly, i, &p0);
        zarray_get_volatile(poly, (i+1)%sz, &p1);

        g2d_line_segment_init_from_points(&seg, p0, p1);

        double q[2];
        if (g2d_line_segment_intersect_line(&seg, &line, q))
            x[xpos++] = q[0];
    }

    qsort(x, xpos, sizeof(double), double_sort_up);

    return xpos;
}